

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void dbuf_put_leb128(DynBuf *s,uint32_t v)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)v;
  uVar2 = uVar3;
  if (0x7f < v) {
    do {
      uVar3 = uVar2 >> 7;
      uVar1 = (uint)uVar2;
      dbuf_putc(s,(byte)uVar2 | 0x80);
      uVar2 = uVar3;
    } while (0x3fff < uVar1);
  }
  dbuf_putc(s,(uint8_t)uVar3);
  return;
}

Assistant:

static void dbuf_put_leb128(DynBuf *s, uint32_t v)
{
    uint32_t a;
    for(;;) {
        a = v & 0x7f;
        v >>= 7;
        if (v != 0) {
            dbuf_putc(s, a | 0x80);
        } else {
            dbuf_putc(s, a);
            break;
        }
    }
}